

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# p_hkdf.cc
# Opt level: O3

int pkey_hkdf_ctrl(EVP_PKEY_CTX *ctx,int type,int p1,void *p2)

{
  int *piVar1;
  int iVar2;
  size_t *out_len;
  uint8_t **out_ptr;
  int line;
  bool bVar3;
  
  if (4 < type - 0x100eU) {
    iVar2 = 0x65;
    line = 0xb5;
LAB_0018d2eb:
    bVar3 = false;
    ERR_put_error(6,0,iVar2,
                  "/workspace/llm4binary/github/license_all_cmakelists_25/jedisct1[P]boringssl/crypto/evp/p_hkdf.cc"
                  ,line);
    goto LAB_0018d2f6;
  }
  piVar1 = (int *)ctx->data;
  switch(type) {
  case 0x100e:
    if (2 < (uint)p1) {
      iVar2 = 0x72;
      line = 0x95;
      goto LAB_0018d2eb;
    }
    *piVar1 = p1;
    break;
  case 0x100f:
    *(void **)(piVar1 + 2) = p2;
    break;
  case 0x1010:
    out_ptr = (uint8_t **)(piVar1 + 4);
    out_len = (size_t *)(piVar1 + 6);
    goto LAB_0018d2bb;
  case 0x1011:
    out_ptr = (uint8_t **)(piVar1 + 8);
    out_len = (size_t *)(piVar1 + 10);
LAB_0018d2bb:
    iVar2 = CBS_stow((CBS *)p2,out_ptr,out_len);
LAB_0018d2c3:
    bVar3 = iVar2 != 0;
    goto LAB_0018d2f6;
  case 0x1012:
    iVar2 = CBB_add_bytes((CBB *)(piVar1 + 0xc),*p2,*(size_t *)((long)p2 + 8));
    goto LAB_0018d2c3;
  }
  bVar3 = true;
LAB_0018d2f6:
  return (int)bVar3;
}

Assistant:

static int pkey_hkdf_ctrl(EVP_PKEY_CTX *ctx, int type, int p1, void *p2) {
  HKDF_PKEY_CTX *hctx = reinterpret_cast<HKDF_PKEY_CTX *>(ctx->data);
  switch (type) {
    case EVP_PKEY_CTRL_HKDF_MODE:
      if (p1 != EVP_PKEY_HKDEF_MODE_EXTRACT_AND_EXPAND &&
          p1 != EVP_PKEY_HKDEF_MODE_EXTRACT_ONLY &&
          p1 != EVP_PKEY_HKDEF_MODE_EXPAND_ONLY) {
        OPENSSL_PUT_ERROR(EVP, EVP_R_INVALID_OPERATION);
        return 0;
      }
      hctx->mode = p1;
      return 1;
    case EVP_PKEY_CTRL_HKDF_MD:
      hctx->md = reinterpret_cast<const EVP_MD *>(p2);
      return 1;
    case EVP_PKEY_CTRL_HKDF_KEY: {
      const CBS *key = reinterpret_cast<const CBS *>(p2);
      if (!CBS_stow(key, &hctx->key, &hctx->key_len)) {
        return 0;
      }
      return 1;
    }
    case EVP_PKEY_CTRL_HKDF_SALT: {
      const CBS *salt = reinterpret_cast<const CBS *>(p2);
      if (!CBS_stow(salt, &hctx->salt, &hctx->salt_len)) {
        return 0;
      }
      return 1;
    }
    case EVP_PKEY_CTRL_HKDF_INFO: {
      const CBS *info = reinterpret_cast<const CBS *>(p2);
      // |EVP_PKEY_CTX_add1_hkdf_info| appends to the info string, rather than
      // replacing it.
      if (!CBB_add_bytes(&hctx->info, CBS_data(info), CBS_len(info))) {
        return 0;
      }
      return 1;
    }
    default:
      OPENSSL_PUT_ERROR(EVP, EVP_R_COMMAND_NOT_SUPPORTED);
      return 0;
  }
}